

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT> *
wasm::WATParser::absheaptype<wasm::WATParser::ParseModuleTypesCtx>
          (Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
           *__return_storage_ptr__,ParseModuleTypesCtx *ctx,Shareability share)

{
  Lexer *this;
  undefined1 auVar1 [12];
  bool bVar2;
  HeapTypeT HVar3;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  string_view expected_03;
  string_view expected_04;
  string_view expected_05;
  string_view expected_06;
  string_view expected_07;
  string_view expected_08;
  string_view expected_09;
  string_view expected_10;
  string_view expected_11;
  string_view expected_12;
  string_view expected_13;
  string local_70;
  Err local_50;
  allocator<char> local_29;
  
  this = &ctx->in;
  expected._M_str = "func";
  expected._M_len = 4;
  bVar2 = Lexer::takeKeyword(this,expected);
  if (bVar2) {
    HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeFuncType
                      (&ctx->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,share);
    auVar1 = HVar3._0_12_;
  }
  else {
    expected_00._M_str = "any";
    expected_00._M_len = 3;
    bVar2 = Lexer::takeKeyword(this,expected_00);
    if (bVar2) {
      HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeAnyType
                        (&ctx->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,share);
      auVar1 = HVar3._0_12_;
    }
    else {
      expected_01._M_str = "extern";
      expected_01._M_len = 6;
      bVar2 = Lexer::takeKeyword(this,expected_01);
      if (bVar2) {
        HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeExternType
                          (&ctx->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,share);
        auVar1 = HVar3._0_12_;
      }
      else {
        expected_02._M_str = "eq";
        expected_02._M_len = 2;
        bVar2 = Lexer::takeKeyword(this,expected_02);
        if (bVar2) {
          HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeEqType
                            (&ctx->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,share);
          auVar1 = HVar3._0_12_;
        }
        else {
          expected_03._M_str = "i31";
          expected_03._M_len = 3;
          bVar2 = Lexer::takeKeyword(this,expected_03);
          if (bVar2) {
            HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeI31Type
                              (&ctx->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,share
                              );
            auVar1 = HVar3._0_12_;
          }
          else {
            expected_04._M_str = "struct";
            expected_04._M_len = 6;
            bVar2 = Lexer::takeKeyword(this,expected_04);
            if (bVar2) {
              HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeStructType
                                (&ctx->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                                 share);
              auVar1 = HVar3._0_12_;
            }
            else {
              expected_05._M_str = "array";
              expected_05._M_len = 5;
              bVar2 = Lexer::takeKeyword(this,expected_05);
              if (bVar2) {
                HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeArrayType
                                  (&ctx->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                                   share);
                auVar1 = HVar3._0_12_;
              }
              else {
                expected_06._M_str = "exn";
                expected_06._M_len = 3;
                bVar2 = Lexer::takeKeyword(this,expected_06);
                if (bVar2) {
                  HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeExnType
                                    (&ctx->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                     ,share);
                  auVar1 = HVar3._0_12_;
                }
                else {
                  expected_07._M_str = "string";
                  expected_07._M_len = 6;
                  bVar2 = Lexer::takeKeyword(this,expected_07);
                  if (bVar2) {
                    HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeStringType
                                      (&ctx->
                                        super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                                       share);
                    auVar1 = HVar3._0_12_;
                  }
                  else {
                    expected_08._M_str = "cont";
                    expected_08._M_len = 4;
                    bVar2 = Lexer::takeKeyword(this,expected_08);
                    if (bVar2) {
                      HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeContType
                                        (&ctx->
                                          super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>,
                                         share);
                      auVar1 = HVar3._0_12_;
                    }
                    else {
                      expected_09._M_str = "none";
                      expected_09._M_len = 4;
                      bVar2 = Lexer::takeKeyword(this,expected_09);
                      if (bVar2) {
                        HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeNoneType
                                          (&ctx->
                                            super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                           ,share);
                        auVar1 = HVar3._0_12_;
                      }
                      else {
                        expected_10._M_str = "noextern";
                        expected_10._M_len = 8;
                        bVar2 = Lexer::takeKeyword(this,expected_10);
                        if (bVar2) {
                          HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeNoextType
                                            (&ctx->
                                              super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                             ,share);
                          auVar1 = HVar3._0_12_;
                        }
                        else {
                          expected_11._M_str = "nofunc";
                          expected_11._M_len = 6;
                          bVar2 = Lexer::takeKeyword(this,expected_11);
                          if (bVar2) {
                            HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::
                                    makeNofuncType(&ctx->
                                                  super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                                  ,share);
                            auVar1 = HVar3._0_12_;
                          }
                          else {
                            expected_12._M_str = "noexn";
                            expected_12._M_len = 5;
                            bVar2 = Lexer::takeKeyword(this,expected_12);
                            if (bVar2) {
                              HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::
                                      makeNoexnType(&ctx->
                                                  super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                                  ,share);
                              auVar1 = HVar3._0_12_;
                            }
                            else {
                              expected_13._M_str = "nocont";
                              expected_13._M_len = 6;
                              bVar2 = Lexer::takeKeyword(this,expected_13);
                              if (!bVar2) {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_70,"expected abstract heap type",
                                           &local_29);
                                Lexer::err(&local_50,this,&local_70);
                                std::__detail::__variant::
                                _Variant_storage<false,wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,wasm::Err>
                                ::_Variant_storage<1ul,wasm::Err>
                                          ((_Variant_storage<false,wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,wasm::Err>
                                            *)__return_storage_ptr__,&local_50);
                                std::__cxx11::string::~string((string *)&local_50);
                                std::__cxx11::string::~string((string *)&local_70);
                                return __return_storage_ptr__;
                              }
                              HVar3 = TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::
                                      makeNocontType(&ctx->
                                                  super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>
                                                  ,share);
                              auVar1 = HVar3._0_12_;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  *(long *)&(__return_storage_ptr__->val).
            super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
            .
            super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
       = auVar1._0_8_;
  *(int *)((long)&(__return_storage_ptr__->val).
                  super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                  .
                  super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                  .
                  super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                  .
                  super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                  .
                  super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                  .
                  super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
          + 8) = auVar1._8_4_;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
           .
           super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
           .
           super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
           .
           super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
           .
           super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
   + 0x20) = '\0';
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::HeapTypeT> absheaptype(Ctx& ctx, Shareability share) {
  if (ctx.in.takeKeyword("func"sv)) {
    return ctx.makeFuncType(share);
  }
  if (ctx.in.takeKeyword("any"sv)) {
    return ctx.makeAnyType(share);
  }
  if (ctx.in.takeKeyword("extern"sv)) {
    return ctx.makeExternType(share);
  }
  if (ctx.in.takeKeyword("eq"sv)) {
    return ctx.makeEqType(share);
  }
  if (ctx.in.takeKeyword("i31"sv)) {
    return ctx.makeI31Type(share);
  }
  if (ctx.in.takeKeyword("struct"sv)) {
    return ctx.makeStructType(share);
  }
  if (ctx.in.takeKeyword("array"sv)) {
    return ctx.makeArrayType(share);
  }
  if (ctx.in.takeKeyword("exn"sv)) {
    return ctx.makeExnType(share);
  }
  if (ctx.in.takeKeyword("string"sv)) {
    return ctx.makeStringType(share);
  }
  if (ctx.in.takeKeyword("cont"sv)) {
    return ctx.makeContType(share);
  }
  if (ctx.in.takeKeyword("none"sv)) {
    return ctx.makeNoneType(share);
  }
  if (ctx.in.takeKeyword("noextern"sv)) {
    return ctx.makeNoextType(share);
  }
  if (ctx.in.takeKeyword("nofunc"sv)) {
    return ctx.makeNofuncType(share);
  }
  if (ctx.in.takeKeyword("noexn"sv)) {
    return ctx.makeNoexnType(share);
  }
  if (ctx.in.takeKeyword("nocont"sv)) {
    return ctx.makeNocontType(share);
  }
  return ctx.in.err("expected abstract heap type");
}